

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  internalJSONNode *piVar1;
  bool condition;
  allocator local_71;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  JSONNode *local_18;
  JSONNode *other_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_18 = other;
  other_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (this->internal != local_18->internal) {
    condition = operator==(this,local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"merging two nodes that aren\'t equal",&local_71);
    JSONDebug::_JSON_ASSERT(condition,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (this->internal->refcount < local_18->internal->refcount) {
      operator=(this,local_18);
    }
    else {
      operator=(local_18,this);
    }
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode &) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == other.internal) return;
	   JSON_ASSERT(*this == other, JSON_TEXT("merging two nodes that aren't equal"));
	   if (internal -> refcount < other.internal -> refcount){
		  *this = other;
	   } else {
		  other = *this;
	   }
    #endif
}